

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicObject.cpp
# Opt level: O2

void __thiscall Js::DynamicObject::Mark(DynamicObject *this,Recycler *recycler)

{
  size_t sVar1;
  ulong uVar2;
  
  if (DAT_0144d983 == '\x01') {
    sVar1 = DynamicTypeHandler::GetInlineSlotsSize
                      (*(DynamicTypeHandler **)((this->super_RecyclableObject).type.ptr + 1));
    uVar2 = 0;
    do {
      Memory::Recycler::TryMarkNonInterior
                (recycler,*(void **)((long)&(this->super_RecyclableObject).super_FinalizableObject.
                                            super_IRecyclerVisitedObject.
                                            _vptr_IRecyclerVisitedObject + uVar2),(void *)0x0);
      uVar2 = uVar2 + 8;
    } while ((sVar1 + 0x20 & 0xfffffffffffffff8) != uVar2);
    return;
  }
  RecyclableObject::Mark(&this->super_RecyclableObject,recycler);
  return;
}

Assistant:

void DynamicObject::Mark(Recycler *recycler)
    {
        // If -RecyclerTrackStress is enabled, DynamicObject will be allocated as Track (and thus Finalize too).
        // Process the mark now.

        if (Js::Configuration::Global.flags.RecyclerTrackStress)
        {
            size_t inlineSlotsSize = this->GetDynamicType()->GetTypeHandler()->GetInlineSlotsSize();
            size_t objectSize = sizeof(DynamicObject) + inlineSlotsSize;
            void ** obj = (void **)this;
            void ** objEnd = obj + (objectSize / sizeof(void *));

            do
            {
                recycler->TryMarkNonInterior(*obj, nullptr);
                obj++;
            } while (obj != objEnd);

            return;
        }

        RecyclableObject::Mark(recycler);
    }